

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O3

UCollator * ucol_safeClone_63(UCollator *coll,void *param_2,int32_t *pBufferSize,UErrorCode *status)

{
  int iVar1;
  UCollator *pUVar2;
  UErrorCode UVar3;
  
  if (status == (UErrorCode *)0x0) {
    return (UCollator *)0x0;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (coll == (UCollator *)0x0) {
      UVar3 = U_ILLEGAL_ARGUMENT_ERROR;
      pUVar2 = (UCollator *)0x0;
    }
    else {
      if ((pBufferSize != (int32_t *)0x0) && (iVar1 = *pBufferSize, *pBufferSize = 1, iVar1 == 0))
      goto LAB_00270f65;
      pUVar2 = (UCollator *)(**(code **)(*(long *)coll + 0x28))();
      UVar3 = U_SAFECLONE_ALLOCATED_WARNING;
      if (pUVar2 == (UCollator *)0x0) {
        UVar3 = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    *status = UVar3;
  }
  else {
LAB_00270f65:
    pUVar2 = (UCollator *)0x0;
  }
  return pUVar2;
}

Assistant:

U_CAPI UCollator* U_EXPORT2
ucol_safeClone(const UCollator *coll, void * /*stackBuffer*/, int32_t * pBufferSize, UErrorCode *status)
{
    if (status == NULL || U_FAILURE(*status)){
        return NULL;
    }
    if (coll == NULL) {
       *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    if (pBufferSize != NULL) {
        int32_t inputSize = *pBufferSize;
        *pBufferSize = 1;
        if (inputSize == 0) {
            return NULL;  // preflighting for deprecated functionality
        }
    }
    Collator *newColl = Collator::fromUCollator(coll)->clone();
    if (newColl == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    } else {
        *status = U_SAFECLONE_ALLOCATED_WARNING;
    }
    return newColl->toUCollator();
}